

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yy_braces(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = G->pos;
  iVar1 = G->thunkpos;
  iVar2 = yymatchChar(G,0x7b);
  if (iVar2 != 0) {
    iVar2 = G->pos;
    iVar5 = G->thunkpos;
    while (iVar3 = yymatchChar(G,0x7d), iVar3 == 0) {
      G->pos = iVar2;
      G->thunkpos = iVar5;
      if (G->limit <= iVar2) {
        iVar3 = yyrefill(G);
        if (iVar3 == 0) break;
        iVar2 = G->pos;
        iVar5 = G->thunkpos;
      }
      iVar2 = iVar2 + 1;
      G->pos = iVar2;
    }
    G->pos = iVar2;
    G->thunkpos = iVar5;
    iVar2 = yymatchChar(G,0x7d);
    if (iVar2 != 0) {
      return 1;
    }
  }
  G->pos = iVar4;
  G->thunkpos = iVar1;
  iVar2 = yymatchChar(G,0x7d);
  if (iVar2 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar1;
    if (G->limit <= iVar4) {
      iVar2 = yyrefill(G);
      if (iVar2 == 0) goto LAB_00103d00;
      iVar4 = G->pos;
    }
    G->pos = iVar4 + 1;
    iVar4 = 1;
  }
  else {
LAB_00103d00:
    G->pos = iVar4;
    G->thunkpos = iVar1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

YY_RULE(int) yy_braces(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "braces"));

  {  int yypos14= G->pos, yythunkpos14= G->thunkpos;  if (!yymatchChar(G, '{')) goto l15;

  l16:;	
  {  int yypos17= G->pos, yythunkpos17= G->thunkpos;
  {  int yypos18= G->pos, yythunkpos18= G->thunkpos;  if (!yymatchChar(G, '}')) goto l18;
  goto l17;
  l18:;	  G->pos= yypos18; G->thunkpos= yythunkpos18;
  }  if (!yymatchDot(G)) goto l17;  goto l16;
  l17:;	  G->pos= yypos17; G->thunkpos= yythunkpos17;
  }  if (!yymatchChar(G, '}')) goto l15;
  goto l14;
  l15:;	  G->pos= yypos14; G->thunkpos= yythunkpos14;
  {  int yypos19= G->pos, yythunkpos19= G->thunkpos;  if (!yymatchChar(G, '}')) goto l19;
  goto l13;
  l19:;	  G->pos= yypos19; G->thunkpos= yythunkpos19;
  }  if (!yymatchDot(G)) goto l13;
  }
  l14:;	  yyprintf((stderr, "  ok   braces"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l13:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "braces"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}